

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int should_send_datagram_frame(quicly_conn_t *conn)

{
  uint uVar1;
  
  uVar1 = 0;
  if (((conn->egress).datagram_frame_payloads.count != 0) &&
     (conn->application != (st_quicly_application_space_t *)0x0)) {
    uVar1 = (uint)((conn->application->cipher).egress.key.aead != (ptls_aead_context_t *)0x0);
  }
  return uVar1;
}

Assistant:

static int should_send_datagram_frame(quicly_conn_t *conn)
{
    if (conn->egress.datagram_frame_payloads.count == 0)
        return 0;
    if (conn->application == NULL)
        return 0;
    if (conn->application->cipher.egress.key.aead == NULL)
        return 0;
    return 1;
}